

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O0

char * Kit_PlaFromTruthNew(uint *pTruth,int nVars,Vec_Int_t *vCover,Vec_Str_t *vStr)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ABC_UINT64_T AVar4;
  ABC_UINT64_T AVar5;
  char *pString;
  int RetValue;
  char *pResult;
  Vec_Str_t *vStr_local;
  Vec_Int_t *vCover_local;
  int nVars_local;
  uint *pTruth_local;
  
  iVar2 = Kit_TruthIsop(pTruth,nVars,vCover,1);
  if ((iVar2 != 0) && (iVar2 != 1)) {
    __assert_fail("RetValue == 0 || RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                  ,0x19b,"char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)")
    ;
  }
  iVar3 = Vec_IntSize(vCover);
  if ((iVar3 == 0) ||
     ((iVar3 = Vec_IntSize(vCover), iVar3 == 1 && (iVar3 = Vec_IntEntry(vCover,0), iVar3 == 0)))) {
    if (iVar2 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                    ,0x19f,
                    "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
    }
    Vec_StrClear(vStr);
    iVar2 = Vec_IntSize(vCover);
    pString = " 1\n";
    if (iVar2 == 0) {
      pString = " 0\n";
    }
    Vec_StrAppend(vStr,pString);
    Vec_StrPush(vStr,'\0');
    pTruth_local = (uint *)Vec_StrArray(vStr);
  }
  else {
    pTruth_local = (uint *)Kit_PlaFromIsop(vStr,nVars,vCover);
    if (iVar2 != 0) {
      Kit_PlaComplement((char *)pTruth_local);
    }
    if (nVars < 6) {
      uVar1 = *pTruth;
      AVar4 = Kit_PlaToTruth6((char *)pTruth_local,nVars);
      if (uVar1 != (uint)AVar4) {
        __assert_fail("pTruth[0] == (unsigned)Kit_PlaToTruth6(pResult, nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                      ,0x1a9,
                      "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
      }
    }
    else if ((nVars == 6) &&
            (AVar4 = *(ABC_UINT64_T *)pTruth, AVar5 = Kit_PlaToTruth6((char *)pTruth_local,6),
            AVar4 != AVar5)) {
      __assert_fail("*((ABC_UINT64_T*)pTruth) == Kit_PlaToTruth6(pResult, nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                    ,0x1ab,
                    "char *Kit_PlaFromTruthNew(unsigned int *, int, Vec_Int_t *, Vec_Str_t *)");
    }
  }
  return (char *)pTruth_local;
}

Assistant:

char * Kit_PlaFromTruthNew( unsigned * pTruth, int nVars, Vec_Int_t * vCover, Vec_Str_t * vStr )
{
    char * pResult;
    // transform truth table into the SOP
    int RetValue = Kit_TruthIsop( pTruth, nVars, vCover, 1 );
    assert( RetValue == 0 || RetValue == 1 );
    // check the case of constant cover
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
    {
        assert( RetValue == 0 );
        Vec_StrClear( vStr );
        Vec_StrAppend( vStr, (Vec_IntSize(vCover) == 0) ? " 0\n" : " 1\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    pResult = Kit_PlaFromIsop( vStr, nVars, vCover );
    if ( RetValue )
        Kit_PlaComplement( pResult );
    if ( nVars < 6 )
        assert( pTruth[0] == (unsigned)Kit_PlaToTruth6(pResult, nVars) );
    else if ( nVars == 6 )
        assert( *((ABC_UINT64_T*)pTruth) == Kit_PlaToTruth6(pResult, nVars) );
    return pResult;
}